

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_679UL,_27UL,_151UL,_327UL,_84UL,_Detail::M1,_Detail::M3<-26>,_Detail::M3<19>,_Detail::M0,_Detail::M3<27>,_Detail::M3<-11>,_Detail::M6<32UL,_15U,_2259277950U,_4294967279U,_2097152U>,_Detail::M3<-16>,_Detail::NoTempering>,_1936040553U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_679UL,_27UL,_151UL,_327UL,_84UL,_Detail::M1,_Detail::M3<_26>,_Detail::M3<19>,_Detail::M0,_Detail::M3<27>,_Detail::M3<_11>,_Detail::M6<32UL,_15U,_2259277950U,_4294967279U,_2097152U>,_Detail::M3<_16>,_Detail::NoTempering>,_1936040553U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [679];
  uint *local_ac0;
  uint local_ab8 [679];
  uint local_1c [3];
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_ab8 + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xa9c);
  local_ac0 = local_ab8;
  Well<unsigned_int,32ul,679ul,27ul,151ul,327ul,84ul,Detail::M1,Detail::M3<-26>,Detail::M3<19>,Detail::M0,Detail::M3<27>,Detail::M3<-11>,Detail::M6<32ul,15u,2259277950u,4294967279u,2097152u>,Detail::M3<-16>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,679ul,27ul,151ul,327ul,84ul,Detail::M1,Detail::M3<_26>,Detail::M3<19>,Detail::M0,Detail::M3<27>,Detail::M3<_11>,Detail::M6<32ul,15u,2259277950u,4294967279u,2097152u>,Detail::M3<_16>,Detail::NoTempering>
              *)this,&local_ac0,local_1c);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_679UL,_27UL,_151UL,_327UL,_84UL,_Detail::M1,_Detail::M3<-26>,_Detail::M3<19>,_Detail::M0,_Detail::M3<27>,_Detail::M3<-11>,_Detail::M6<32UL,_15U,_2259277950U,_4294967279U,_2097152U>,_Detail::M3<-16>,_Detail::NoTempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }